

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.cc
# Opt level: O0

void __thiscall AGC::work(AGC *this,size_t nsamples,complex<float> *ci,complex<float> *co)

{
  float fVar1;
  float *pfVar2;
  long in_RCX;
  ulong in_RSI;
  float *in_RDI;
  float fVar3;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  size_t i;
  complex<float> *in_stack_ffffffffffffff98;
  complex<float> *__z;
  ulong local_28;
  
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 4) {
    __z = (complex<float> *)(in_RDI + 2);
    std::operator*(in_stack_ffffffffffffff98,(float *)0x1b704c);
    *(undefined8 *)(in_RCX + local_28 * 8) = extraout_XMM0_Qa;
    std::operator*(in_stack_ffffffffffffff98,(float *)0x1b707e);
    *(undefined8 *)(in_RCX + 8 + local_28 * 8) = extraout_XMM0_Qa_00;
    std::operator*(in_stack_ffffffffffffff98,(float *)0x1b70b1);
    *(undefined8 *)(in_RCX + 0x10 + local_28 * 8) = extraout_XMM0_Qa_01;
    std::operator*(in_stack_ffffffffffffff98,(float *)0x1b70e4);
    *(undefined8 *)(in_RCX + 0x18 + local_28 * 8) = extraout_XMM0_Qa_02;
    fVar1 = in_RDI[3];
    fVar3 = std::abs<float>(__z);
    in_RDI[2] = fVar1 * (0.5 - fVar3) + in_RDI[2];
    pfVar2 = std::max<float>(in_RDI + 2,in_RDI);
    in_RDI[2] = *pfVar2;
    pfVar2 = std::min<float>(in_RDI + 2,in_RDI + 1);
    in_RDI[2] = *pfVar2;
  }
  return;
}

Assistant:

void AGC::work(
    size_t nsamples,
    std::complex<float>* ci,
    std::complex<float>* co) {
  // Process 4 samples at a time.
  for (size_t i = 0; i < nsamples; i += 4) {
    // Apply gain
    co[i+0] = ci[i+0] * gain_;
    co[i+1] = ci[i+1] * gain_;
    co[i+2] = ci[i+2] * gain_;
    co[i+3] = ci[i+3] * gain_;

    // Update gain.
    // Use only the first sample and ignore the others.
    gain_ += alpha_ * (0.5 - abs(co[i]));
    gain_ = std::max(gain_, min_);
    gain_ = std::min(gain_, max_);
  }
}